

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O0

void __thiscall
wallet::coinselector_tests::ApproximateBestSubset::test_method(ApproximateBestSubset *this)

{
  long lVar1;
  bool bVar2;
  type available_coins_00;
  long in_FS_OFFSET;
  int i;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> wallet;
  optional<wallet::SelectionResult> result;
  CoinsResult available_coins;
  FastRandomContext rand;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc48;
  char *this_00;
  CoinsResult *in_stack_fffffffffffffc50;
  lazy_ostream *prev;
  FastRandomContext *in_stack_fffffffffffffc58;
  char *this_01;
  SelectionResult *in_stack_fffffffffffffc68;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *in_stack_fffffffffffffc78;
  lazy_ostream *in_stack_fffffffffffffc80;
  allocator<char> *in_stack_fffffffffffffc88;
  unit_test_log_t *this_02;
  undefined7 in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc97;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc98;
  undefined7 in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffcb7;
  NodeContext *in_stack_fffffffffffffcb8;
  CoinEligibilityFilter *in_stack_fffffffffffffcc0;
  CWallet *in_stack_fffffffffffffcc8;
  int local_2f8;
  undefined4 local_2dc;
  size_type local_2d8;
  undefined1 local_2d0 [2];
  undefined1 in_stack_fffffffffffffd32;
  undefined1 in_stack_fffffffffffffd33;
  int in_stack_fffffffffffffd34;
  CAmount *in_stack_fffffffffffffd38;
  CWallet *in_stack_fffffffffffffd40;
  CoinsResult *in_stack_fffffffffffffd48;
  lazy_ostream local_280;
  undefined1 local_270 [16];
  undefined1 local_260 [48];
  CFeeRate in_stack_fffffffffffffdd0;
  lazy_ostream local_200 [2];
  assertion_result local_1e0 [2];
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  allocator<char> local_179 [313];
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext
            (in_stack_fffffffffffffc58,SUB81((ulong)in_stack_fffffffffffffc50 >> 0x38,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc98,
             (char *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
             in_stack_fffffffffffffc88);
  NewWallet(in_stack_fffffffffffffcb8,
            (string *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
  std::__cxx11::string::~string(in_stack_fffffffffffffc48);
  std::allocator<char>::~allocator(local_179);
  CoinsResult::CoinsResult(in_stack_fffffffffffffc50);
  for (local_2f8 = 0; local_2f8 < 1000; local_2f8 = local_2f8 + 1) {
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
               in_stack_fffffffffffffc58);
    local_188 = 100000000000;
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_fffffffffffffc48,0);
    in_stack_fffffffffffffc58 =
         (FastRandomContext *)((ulong)in_stack_fffffffffffffc58 & 0xffffffff00000000);
    in_stack_fffffffffffffc50 =
         (CoinsResult *)((ulong)in_stack_fffffffffffffc50 & 0xffffffff00000000);
    in_stack_fffffffffffffc48 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((ulong)in_stack_fffffffffffffc48 & 0xffffffff00000000);
    add_coin(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
             in_stack_fffffffffffffdd0,in_stack_fffffffffffffd34,(bool)in_stack_fffffffffffffd33,
             in_stack_ffffffffffffffc0,(bool)in_stack_fffffffffffffd32,in_stack_ffffffffffffffd0);
  }
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             in_stack_fffffffffffffc58);
  local_198 = 300000000;
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_fffffffffffffc48,0);
  this_01 = (char *)((ulong)in_stack_fffffffffffffc58 & 0xffffffff00000000);
  prev = (lazy_ostream *)((ulong)in_stack_fffffffffffffc50 & 0xffffffff00000000);
  this_00 = (char *)((ulong)in_stack_fffffffffffffc48 & 0xffffffff00000000);
  add_coin(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
           in_stack_fffffffffffffdd0,in_stack_fffffffffffffd34,(bool)in_stack_fffffffffffffd33,
           in_stack_ffffffffffffffc0,(bool)in_stack_fffffffffffffd32,in_stack_ffffffffffffffd0);
  available_coins_00 =
       std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
                 ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)this_01);
  KnapsackGroupOutputs
            ((CoinsResult *)available_coins_00,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  local_1a8 = 0x175a588b00;
  KnapsackSolver((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                 in_stack_fffffffffffffc88,(CAmount *)in_stack_fffffffffffffc80,
                 (CAmount)in_stack_fffffffffffffc78,
                 (FastRandomContext *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70))
  ;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc88,
               (const_string *)in_stack_fffffffffffffc80,(size_t)in_stack_fffffffffffffc78,
               (const_string *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
    boost::test_tools::assertion_result::assertion_result<std::optional<wallet::SelectionResult>>
              ((assertion_result *)this_01,(optional<wallet::SelectionResult> *)prev);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    this_00 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1e0,local_200,(const_string *)&stack0xfffffffffffffde0,0x331,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc88,
               (const_string *)in_stack_fffffffffffffc80,(size_t)in_stack_fffffffffffffc78,
               (const_string *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(prev,(char (*) [1])this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    std::optional<wallet::SelectionResult>::operator->((optional<wallet::SelectionResult> *)this_00)
    ;
    local_280._8_8_ = SelectionResult::GetSelectedValue(in_stack_fffffffffffffc68);
    local_280._vptr_lazy_ostream = (_func_int **)0x175a588b00;
    this_01 = "1003 * COIN";
    prev = &local_280;
    this_00 = "result->GetSelectedValue()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_260,local_270,0x332,1,2,&local_280.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    this_02 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_02,(const_string *)in_stack_fffffffffffffc80,(size_t)in_stack_fffffffffffffc78,
               (const_string *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
    in_stack_fffffffffffffc80 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(prev,(char (*) [1])this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    std::optional<wallet::SelectionResult>::operator->((optional<wallet::SelectionResult> *)this_00)
    ;
    in_stack_fffffffffffffc78 = SelectionResult::GetInputSet((SelectionResult *)this_00);
    local_2d8 = std::
                set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                ::size((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                        *)this_00);
    local_2dc = 2;
    this_01 = "2U";
    prev = (lazy_ostream *)&local_2dc;
    this_00 = "result->GetInputSet().size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&stack0xfffffffffffffd40,local_2d0,0x333,1,2,&local_2d8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_00);
    in_stack_fffffffffffffc77 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffc77);
  std::optional<wallet::SelectionResult>::~optional((optional<wallet::SelectionResult> *)this_00);
  CoinsResult::~CoinsResult((CoinsResult *)this_00);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)this_01);
  FastRandomContext::~FastRandomContext((FastRandomContext *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(ApproximateBestSubset)
{
    FastRandomContext rand{};
    std::unique_ptr<CWallet> wallet = NewWallet(m_node);

    CoinsResult available_coins;

    // Test vValue sort order
    for (int i = 0; i < 1000; i++)
        add_coin(available_coins, *wallet, 1000 * COIN);
    add_coin(available_coins, *wallet, 3 * COIN);

    const auto result = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard), 1003 * COIN, CENT, rand);
    BOOST_CHECK(result);
    BOOST_CHECK_EQUAL(result->GetSelectedValue(), 1003 * COIN);
    BOOST_CHECK_EQUAL(result->GetInputSet().size(), 2U);
}